

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

uint __thiscall
glcts::TessellationShaderInvarianceRule7Test::getAmountOfIterations
          (TessellationShaderInvarianceRule7Test *this)

{
  size_type sVar1;
  size_type sVar2;
  TessellationShaderInvarianceRule7Test *this_local;
  
  sVar1 = std::
          vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
          ::size(&this->m_test_quads_iterations);
  if (sVar1 != 0) {
    sVar1 = std::
            vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
            ::size(&this->m_test_triangles_iterations);
    if (sVar1 != 0) goto LAB_015e3115;
  }
  initTestIterations(this);
LAB_015e3115:
  sVar1 = std::
          vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
          ::size(&this->m_test_quads_iterations);
  sVar2 = std::
          vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
          ::size(&this->m_test_triangles_iterations);
  return (int)sVar1 + (int)sVar2;
}

Assistant:

unsigned int TessellationShaderInvarianceRule7Test::getAmountOfIterations()
{
	if (m_test_quads_iterations.size() == 0 || m_test_triangles_iterations.size() == 0)
	{
		initTestIterations();
	}

	return (unsigned int)(m_test_quads_iterations.size() + m_test_triangles_iterations.size());
}